

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O3

Mtbdd * __thiscall sylvan::Mtbdd::operator-=(Mtbdd *this,Mtbdd *other)

{
  undefined1 local_50 [64];
  
  local_50._16_8_ = this->mtbdd;
  local_50._24_8_ = other->mtbdd;
  local_50._0_8_ = mtbdd_apply_WRAP;
  local_50._8_8_ = (__pointer_type)0x1;
  local_50._32_8_ = mtbdd_op_minus_CALL;
  lace_run_task((Task *)local_50);
  this->mtbdd = local_50._16_8_;
  return this;
}

Assistant:

Mtbdd&
Mtbdd::operator-=(const Mtbdd& other)
{
    mtbdd = mtbdd_minus(mtbdd, other.mtbdd);
    return *this;
}